

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# einsum.cpp
# Opt level: O2

int __thiscall
ncnn::Einsum::forward
          (Einsum *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  Mat *pMVar4;
  pointer pbVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens;
  int iVar11;
  long lVar12;
  ulong uVar13;
  size_t b;
  long lVar14;
  int k;
  ulong uVar15;
  long lVar16;
  int i;
  pointer pMVar17;
  int j;
  long lVar18;
  float fVar19;
  allocator_type local_a9;
  undefined8 local_a8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_a0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_98;
  Option *local_90;
  size_t local_88;
  pointer local_80;
  vector<int,_std::allocator<int>_> indexes;
  vector<int,_std::allocator<int>_> dim_sizes;
  
  local_88 = ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start)->elemsize;
  local_a0 = bottom_blobs;
  local_98 = top_blobs;
  local_90 = opt;
  if (((this->lhs_tokens).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->lhs_tokens).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (bVar6 = std::operator==(&this->rhs_token,"ii"), bVar6)) {
    pMVar4 = (local_98->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,1,local_88,local_90->blob_allocator);
    local_a8 = 0xffffffffffffff9c;
    if (((float *)pMVar4->data != (float *)0x0) && ((long)pMVar4->c * pMVar4->cstep != 0)) {
      pMVar17 = (local_a0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar13 = 0;
      uVar15 = (ulong)(uint)pMVar17->h;
      if (pMVar17->h < 1) {
        uVar15 = uVar13;
      }
      fVar19 = 0.0;
      for (; uVar15 != uVar13; uVar13 = uVar13 + 1) {
        fVar19 = fVar19 + *(float *)((long)pMVar17->data +
                                    uVar13 * 4 + pMVar17->elemsize * uVar13 * (long)pMVar17->w);
      }
      *(float *)pMVar4->data = fVar19;
      local_a8 = 0;
    }
    goto LAB_004f512d;
  }
  tokens = &this->lhs_tokens;
  local_a8 = 0xffffffffffffff9c;
  indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 1;
  std::vector<int,_std::allocator<int>_>::vector
            (&dim_sizes,0x10,(value_type_conflict1 *)&indexes,&local_a9);
  local_80 = (local_a0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  pMVar17 = (local_a0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  pbVar5 = (tokens->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar9 = 0;
  for (lVar14 = 0; lVar14 != ((long)pMVar17 - (long)local_80) / 0x48; lVar14 = lVar14 + 1) {
    uVar2 = local_80[lVar14].dims;
    uVar15 = 0;
    if (0 < (int)uVar2) {
      uVar15 = (ulong)uVar2;
    }
    for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
      iVar11 = local_80[lVar14].w;
      iVar3 = local_80[lVar14].h;
      iVar7 = 1;
      if (uVar2 == 1) {
        iVar7 = iVar11;
      }
      iVar10 = iVar7;
      if (uVar13 == 0) {
        iVar10 = iVar3;
      }
      if (uVar2 != 2) {
        iVar10 = iVar7;
      }
      iVar7 = iVar10;
      if (uVar13 == 1) {
        iVar7 = iVar11;
      }
      if (uVar2 != 2) {
        iVar7 = iVar10;
      }
      iVar10 = iVar7;
      if (uVar13 == 0) {
        iVar10 = local_80[lVar14].c;
      }
      if (uVar2 != 3) {
        iVar10 = iVar7;
      }
      iVar7 = iVar10;
      if (uVar13 == 1) {
        iVar7 = iVar3;
      }
      if (uVar2 != 3) {
        iVar7 = iVar10;
      }
      iVar10 = iVar7;
      if (uVar13 == 2) {
        iVar10 = iVar11;
      }
      if (uVar2 != 3) {
        iVar10 = iVar7;
      }
      iVar7 = local_80[lVar14].c;
      if (uVar13 != 0) {
        iVar7 = iVar10;
      }
      if (uVar2 != 4) {
        iVar7 = iVar10;
      }
      iVar10 = iVar7;
      if (uVar13 == 1) {
        iVar10 = local_80[lVar14].d;
      }
      if (uVar2 == 4) {
        iVar7 = iVar10;
      }
      if (uVar13 != 2) {
        iVar3 = iVar7;
      }
      if (uVar2 != 4) {
        iVar3 = iVar7;
      }
      if (uVar13 != 3) {
        iVar11 = iVar3;
      }
      if (uVar2 != 4) {
        iVar11 = iVar3;
      }
      cVar1 = pbVar5[lVar14]._M_dataplus._M_p[uVar13];
      dim_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)cVar1 + -0x69] = iVar11;
      uVar8 = (int)cVar1 - 0x68;
      if ((int)uVar9 <= (int)uVar8) {
        uVar9 = uVar8;
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::resize(&dim_sizes,(ulong)uVar9);
  uVar2 = (uint)(this->rhs_token)._M_string_length;
  std::vector<int,_std::allocator<int>_>::vector(&indexes,(ulong)uVar9,&local_a9);
  pMVar17 = (pointer)(ulong)uVar2;
  switch(uVar2) {
  case 1:
    pMVar4 = (local_98->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,*dim_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,local_88,local_90->blob_allocator);
    if ((pMVar4->data != (void *)0x0) && ((long)pMVar4->c * pMVar4->cstep != 0)) {
      local_a8 = 0;
      for (lVar14 = 0; lVar14 < pMVar4->w; lVar14 = lVar14 + 1) {
        *(int *)CONCAT44(indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) = (int)lVar14;
        fVar19 = sum_dim(&dim_sizes,1,local_a0,tokens,&indexes);
        *(float *)((long)pMVar4->data + lVar14 * 4) = fVar19;
      }
    }
    break;
  case 2:
    pMVar4 = (local_98->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,dim_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[1],
                *dim_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,local_88,local_90->blob_allocator);
    if ((pMVar4->data != (void *)0x0) && ((long)pMVar4->c * pMVar4->cstep != 0)) {
      local_80 = (pointer)(ulong)uVar2;
      for (lVar14 = 0; lVar14 < pMVar4->h; lVar14 = lVar14 + 1) {
        *(int *)CONCAT44(indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) = (int)lVar14;
        uVar15 = (ulong)(uint)pMVar4->w;
        for (lVar18 = 0; lVar18 < (int)uVar15; lVar18 = lVar18 + 1) {
          *(int *)(CONCAT44(indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + 4) = (int)lVar18;
          fVar19 = sum_dim(&dim_sizes,2,local_a0,tokens,&indexes);
          uVar15 = (ulong)pMVar4->w;
          *(float *)((long)pMVar4->data + lVar18 * 4 + pMVar4->elemsize * lVar14 * uVar15) = fVar19;
        }
      }
      if ((int)local_80 != 4) {
        pMVar17 = local_80;
        if ((int)local_80 == 3) goto switchD_004f4d84_caseD_3;
        goto switchD_004f4d84_default;
      }
      goto switchD_004f4d84_caseD_4;
    }
    break;
  case 3:
switchD_004f4d84_caseD_3:
    pMVar4 = (local_98->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,dim_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[2],
                dim_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[1],
                *dim_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,local_88,local_90->blob_allocator);
    if ((pMVar4->data != (void *)0x0) && (uVar15 = (ulong)pMVar4->c, pMVar4->cstep * uVar15 != 0)) {
      local_80 = pMVar17;
      for (lVar14 = 0; lVar14 < (int)uVar15; lVar14 = lVar14 + 1) {
        *(int *)CONCAT44(indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) = (int)lVar14;
        for (lVar18 = 0; lVar18 < pMVar4->h; lVar18 = lVar18 + 1) {
          *(int *)(CONCAT44(indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + 4) = (int)lVar18;
          uVar15 = (ulong)(uint)pMVar4->w;
          for (lVar16 = 0; lVar16 < (int)uVar15; lVar16 = lVar16 + 1) {
            *(int *)(CONCAT44(indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_) + 8) = (int)lVar16;
            fVar19 = sum_dim(&dim_sizes,3,local_a0,tokens,&indexes);
            uVar15 = (ulong)pMVar4->w;
            *(float *)((long)pMVar4->data +
                      lVar16 * 4 + (uVar15 * lVar18 + pMVar4->cstep * lVar14) * pMVar4->elemsize) =
                 fVar19;
          }
        }
        uVar15 = (ulong)(uint)pMVar4->c;
      }
      if ((int)local_80 != 4) goto switchD_004f4d84_default;
      goto switchD_004f4d84_caseD_4;
    }
    break;
  case 4:
switchD_004f4d84_caseD_4:
    pMVar4 = (local_98->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,dim_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[3],
                dim_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[2],
                dim_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[1],
                *dim_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,local_88,local_90->blob_allocator);
    if ((pMVar4->data != (void *)0x0) && (uVar15 = (ulong)pMVar4->c, pMVar4->cstep * uVar15 != 0)) {
      local_a8 = 0;
      for (lVar14 = 0; lVar14 < (int)uVar15; lVar14 = lVar14 + 1) {
        *(int *)CONCAT44(indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) = (int)lVar14;
        for (lVar18 = 0; lVar18 < pMVar4->d; lVar18 = lVar18 + 1) {
          *(int *)(CONCAT44(indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + 4) = (int)lVar18;
          for (lVar16 = 0; lVar16 < pMVar4->h; lVar16 = lVar16 + 1) {
            *(int *)(CONCAT44(indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_) + 8) = (int)lVar16;
            uVar15 = (ulong)(uint)pMVar4->w;
            for (lVar12 = 0; lVar12 < (int)uVar15; lVar12 = lVar12 + 1) {
              *(int *)(CONCAT44(indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_) + 0xc) = (int)lVar12;
              fVar19 = sum_dim(&dim_sizes,4,local_a0,tokens,&indexes);
              uVar15 = (ulong)pMVar4->w;
              *(float *)((long)pMVar4->data +
                        lVar12 * 4 +
                        ((pMVar4->h * lVar18 + lVar16) * uVar15 + pMVar4->cstep * lVar14) *
                        pMVar4->elemsize) = fVar19;
            }
          }
        }
        uVar15 = (ulong)(uint)pMVar4->c;
      }
    }
    break;
  default:
switchD_004f4d84_default:
    local_a8 = 0;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&indexes.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&dim_sizes.super__Vector_base<int,_std::allocator<int>_>);
LAB_004f512d:
  return (int)local_a8;
}

Assistant:

int Einsum::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // assert bottom_blobs.size() == lhs_tokens.size()
    // assert top_blobs.size() == 1

    size_t elemsize = bottom_blobs[0].elemsize;

    if (lhs_tokens.empty() && rhs_token == "ii")
    {
        // assert bottom_blobs.size() == 1
        // assert bottom_blob.dims == 2
        // assert bottom_blob.w == bottom_blob.h

        // trace
        Mat& top_blob = top_blobs[0];
        top_blob.create(1, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const Mat& bottom_blob = bottom_blobs[0];

        float sum = 0.f;

        for (int i = 0; i < bottom_blob.h; i++)
        {
            sum += bottom_blob.row(i)[i];
        }

        top_blob[0] = sum;

        return 0;
    }

    // resolve dimension sizes
    std::vector<int> dim_sizes(16, 1); // map ijklmnopqrstuvwx -> dim_size
    int dim_sizes_count = 0;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        const std::string& lhs_token = lhs_tokens[b];
        const Mat& bottom_blob = bottom_blobs[b];
        const int in_dims = bottom_blob.dims;

        for (int s = 0; s < in_dims; s++)
        {
            int dim_size = 1;
            if (in_dims == 1) dim_size = bottom_blob.w;
            if (in_dims == 2 && s == 0) dim_size = bottom_blob.h;
            if (in_dims == 2 && s == 1) dim_size = bottom_blob.w;
            if (in_dims == 3 && s == 0) dim_size = bottom_blob.c;
            if (in_dims == 3 && s == 1) dim_size = bottom_blob.h;
            if (in_dims == 3 && s == 2) dim_size = bottom_blob.w;
            if (in_dims == 4 && s == 0) dim_size = bottom_blob.c;
            if (in_dims == 4 && s == 1) dim_size = bottom_blob.d;
            if (in_dims == 4 && s == 2) dim_size = bottom_blob.h;
            if (in_dims == 4 && s == 3) dim_size = bottom_blob.w;

            int dim_sizes_index = lhs_token[s] - 'i';
            dim_sizes[dim_sizes_index] = dim_size;
            dim_sizes_count = std::max(dim_sizes_count, dim_sizes_index + 1);
        }
    }

    dim_sizes.resize(dim_sizes_count);

    const int out_dims = (int)rhs_token.size();

    std::vector<int> indexes(dim_sizes_count);

    if (out_dims == 1)
    {
        Mat& top_blob = top_blobs[0];
        top_blob.create(dim_sizes[0], elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int i = 0; i < top_blob.w; i++)
        {
            indexes[0] = i;

            float sum = sum_dim(dim_sizes, 1, bottom_blobs, lhs_tokens, indexes);

            top_blob[i] = sum;
        }
    }

    if (out_dims == 2)
    {
        Mat& top_blob = top_blobs[0];
        top_blob.create(dim_sizes[1], dim_sizes[0], elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int i = 0; i < top_blob.h; i++)
        {
            indexes[0] = i;

            for (int j = 0; j < top_blob.w; j++)
            {
                indexes[1] = j;

                float sum = sum_dim(dim_sizes, 2, bottom_blobs, lhs_tokens, indexes);

                top_blob.row(i)[j] = sum;
            }
        }
    }

    if (out_dims == 3)
    {
        Mat& top_blob = top_blobs[0];
        top_blob.create(dim_sizes[2], dim_sizes[1], dim_sizes[0], elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int i = 0; i < top_blob.c; i++)
        {
            indexes[0] = i;

            for (int j = 0; j < top_blob.h; j++)
            {
                indexes[1] = j;

                for (int k = 0; k < top_blob.w; k++)
                {
                    indexes[2] = k;

                    float sum = sum_dim(dim_sizes, 3, bottom_blobs, lhs_tokens, indexes);

                    top_blob.channel(i).row(j)[k] = sum;
                }
            }
        }
    }

    if (out_dims == 4)
    {
        Mat& top_blob = top_blobs[0];
        top_blob.create(dim_sizes[3], dim_sizes[2], dim_sizes[1], dim_sizes[0], elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int i = 0; i < top_blob.c; i++)
        {
            indexes[0] = i;

            for (int j = 0; j < top_blob.d; j++)
            {
                indexes[1] = j;

                for (int k = 0; k < top_blob.h; k++)
                {
                    indexes[2] = k;

                    for (int l = 0; l < top_blob.w; l++)
                    {
                        indexes[3] = l;

                        float sum = sum_dim(dim_sizes, 4, bottom_blobs, lhs_tokens, indexes);

                        top_blob.channel(i).depth(j).row(k)[l] = sum;
                    }
                }
            }
        }
    }

    return 0;
}